

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t RenderBlockData(matroska_block *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  void *pvVar1;
  size_t sVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  ebml_context *peVar6;
  bool_t bVar7;
  ebml_master *peVar8;
  ebml_integer *Element_00;
  int64_t iVar9;
  char *__ptr;
  filepos_t fVar10;
  ebml_context *peVar11;
  err_t eVar12;
  size_t sVar13;
  undefined1 local_e0 [8];
  array TmpBuf;
  uint8_t *OutBuf;
  int32_t *i_1;
  int32_t PrevSize;
  int32_t DataSize;
  size_t LaceSize;
  size_t i;
  uint8_t *LaceHead;
  bool_t CanCompress;
  MatroskaContentEncodingScope CompressionScope;
  MatroskaTrackEncodingCompAlgo CompressionAlgo;
  ebml_element *Header;
  ebml_element *Elt2;
  ebml_element *Elt;
  size_t BlockHeadSize;
  size_t Written;
  size_t ToWrite;
  uint8_t *Cursor;
  matroska_block *pmStack_50;
  uint8_t BlockHead [5];
  err_t Err;
  filepos_t *Rendered_local;
  int ForProfile_local;
  bool_t bWithDefault_local;
  bool_t bForceWithoutMandatory_local;
  stream *Output_local;
  matroska_block *Element_local;
  
  pmStack_50 = (matroska_block *)0x0;
  Elt = (ebml_element *)0x4;
  _CompressionScope = (ebml_integer *)0x0;
  CanCompress._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
  CanCompress._0_4_ = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
  if (Element->Lacing == '\x04') {
    __assert_fail("Element->Lacing != LACING_AUTO",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6a7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  if (Element->TrackNumber < 0x80) {
    Cursor._3_1_ = (byte)Element->TrackNumber | 0x80;
    ToWrite = (long)&Cursor + 4;
  }
  else {
    if (0x3fff < Element->TrackNumber) {
      return (err_t)(matroska_block *)0xfffffffffffffffd;
    }
    Cursor._3_1_ = (byte)(Element->TrackNumber >> 8) | 0x40;
    Cursor._4_1_ = (undefined1)Element->TrackNumber;
    ToWrite = (long)&Cursor + 5;
    Elt = (ebml_element *)0x5;
  }
  *(char *)(ToWrite + 1) = (char)Element->LocalTimestamp;
  *(char *)ToWrite = (char)((ushort)Element->LocalTimestamp >> 8);
  ToWrite = ToWrite + 2;
  *(byte *)ToWrite = 0;
  if (Element->Invisible != 0) {
    *(byte *)ToWrite = *(byte *)ToWrite | 8;
  }
  *(byte *)ToWrite = *(byte *)ToWrite | Element->Lacing << 1;
  peVar6 = MATROSKA_getContextSimpleBlock();
  bVar7 = EBML_ElementIsType((ebml_element *)Element,peVar6);
  if (bVar7 != 0) {
    if (Element->IsKeyframe != 0) {
      *(byte *)ToWrite = *(byte *)ToWrite | 0x80;
    }
    if (Element->IsDiscardable != 0) {
      *(byte *)ToWrite = *(byte *)ToWrite | 1;
    }
  }
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6c7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  pmStack_50 = (matroska_block *)
               (**(code **)((long)(Output->Base).VMT + 0x70))
                         (Output,(long)&Cursor + 3,Elt,&BlockHeadSize);
  if (pmStack_50 == (matroska_block *)0x0) {
    if ((ebml_element *)BlockHeadSize == Elt) {
      if (Rendered != (filepos_t *)0x0) {
        *Rendered = BlockHeadSize;
      }
      if (Element->WriteTrack == (ebml_master *)0x0) {
        __assert_fail("Element->WriteTrack!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x6d2,
                      "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
      peVar8 = Element->WriteTrack;
      peVar6 = MATROSKA_getContextContentEncodings();
      peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar6,0,0,0);
      if (peVar8 != (ebml_master *)0x0) {
        peVar6 = MATROSKA_getContextContentEncoding();
        peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar6,0,0,0);
        if ((peVar8->Base).Base.Children != (nodetree *)0x0) {
          if (peVar8 == (ebml_master *)(peVar8->Base).Base.Next) {
            __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x6d9,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          if ((peVar8->Base).Base.Next != (nodetree *)0x0) {
            return (err_t)(matroska_block *)0xfffffffffffffffd;
          }
          peVar6 = MATROSKA_getContextContentEncodingScope();
          Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar6,0,0,0);
          if (Element_00 != (ebml_integer *)0x0) {
            iVar9 = EBML_IntegerValue(Element_00);
            CanCompress._0_4_ = (MatroskaContentEncodingScope)iVar9;
          }
          peVar6 = MATROSKA_getContextContentCompression();
          peVar8 = (ebml_master *)EBML_MasterFindFirstElt(peVar8,peVar6,0,0,0);
          if (peVar8 == (ebml_master *)0x0) {
            return (err_t)(matroska_block *)0xfffffffffffffffd;
          }
          peVar6 = MATROSKA_getContextContentCompAlgo();
          _CompressionScope = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar6,1,1,ForProfile);
          if (_CompressionScope != (ebml_integer *)0x0) {
            iVar9 = EBML_IntegerValue(_CompressionScope);
            CanCompress._4_4_ = (MatroskaTrackEncodingCompAlgo)iVar9;
          }
          if (CanCompress._4_4_ != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP &&
              CanCompress._4_4_ != MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
            return (err_t)(matroska_block *)0xfffffffffffffffb;
          }
          if (CanCompress._4_4_ == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP) {
            peVar6 = MATROSKA_getContextContentCompSettings();
            _CompressionScope = (ebml_integer *)EBML_MasterFindFirstElt(peVar8,peVar6,0,0,0);
          }
        }
      }
      if (Element->Lacing == '\x04') {
        cVar3 = GetBestLacingType(Element,ForProfile);
        Element->Lacing = cVar3;
      }
      if (Element->Lacing != '\0') {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x705,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        __ptr = (char *)malloc(((Element->SizeList)._Used & 0xfffffffffffffffc) + 1);
        _PrevSize = 1;
        if (__ptr == (char *)0x0) {
          return (err_t)(matroska_block *)0xfffffffffffffffe;
        }
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x70d,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        *__ptr = (char)((Element->SizeList)._Used >> 2) + -1;
        if (Element->Lacing == '\x03') {
          fVar10 = GetBlockFrameSize(Element,0,&_CompressionScope->Base,CanCompress._4_4_,
                                     (MatroskaContentEncodingScope)CanCompress);
          i_1._4_4_ = (int)fVar10;
          bVar4 = EBML_CodedSizeLength((long)i_1._4_4_,'\0',1);
          bVar4 = EBML_CodedValueLength((long)i_1._4_4_,(ulong)bVar4,(uint8_t *)(__ptr + 1),1);
          _PrevSize = (ulong)bVar4 + 1;
          LaceSize = 1;
          while( true ) {
            if (Element == (matroska_block *)0xffffffffffffff78) {
              __assert_fail("&(Element->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x712,
                            "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            if (((Element->SizeList)._Used >> 2) - 1 <= LaceSize) break;
            fVar10 = GetBlockFrameSize(Element,LaceSize,&_CompressionScope->Base,CanCompress._4_4_,
                                       (MatroskaContentEncodingScope)CanCompress);
            iVar5 = (int)fVar10;
            bVar4 = EBML_CodedSizeLengthSigned((long)(iVar5 - i_1._4_4_),'\0');
            bVar4 = EBML_CodedValueLengthSigned
                              ((long)(iVar5 - i_1._4_4_),(ulong)bVar4,(uint8_t *)(__ptr + _PrevSize)
                              );
            _PrevSize = bVar4 + _PrevSize;
            LaceSize = LaceSize + 1;
            i_1._4_4_ = iVar5;
          }
        }
        else if (Element->Lacing == '\x01') {
          LaceSize = 0;
          while( true ) {
            if (Element == (matroska_block *)0xffffffffffffff78) {
              __assert_fail("&(Element->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x71b,
                            "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            if (((Element->SizeList)._Used >> 2) - 1 <= LaceSize) break;
            fVar10 = GetBlockFrameSize(Element,LaceSize,&_CompressionScope->Base,CanCompress._4_4_,
                                       (MatroskaContentEncodingScope)CanCompress);
            for (i_1._4_4_ = (int)fVar10; 0xfe < i_1._4_4_; i_1._4_4_ = i_1._4_4_ + -0xff) {
              __ptr[_PrevSize] = -1;
              _PrevSize = _PrevSize + 1;
            }
            __ptr[_PrevSize] = (char)i_1._4_4_;
            LaceSize = LaceSize + 1;
            _PrevSize = _PrevSize + 1;
          }
        }
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x72a,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        if (((Element->SizeList)._Used & 0xfffffffffffffffc) + 1 < _PrevSize) {
          __assert_fail("LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x72a,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x72b,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        pmStack_50 = (matroska_block *)
                     (**(code **)((long)(Output->Base).VMT + 0x70))
                               (Output,__ptr,_PrevSize,&BlockHeadSize);
        if (pmStack_50 != (matroska_block *)0x0) {
          return (err_t)pmStack_50;
        }
        if (Rendered != (filepos_t *)0x0) {
          *Rendered = BlockHeadSize + *Rendered;
        }
        free(__ptr);
      }
      if (Element == (matroska_block *)0x0) {
        __assert_fail("(const void*)(Element)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x732,
                      "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
      (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0x20))
                (Element,0x180,&Element->WriteTrack,8);
      if (Element == (matroska_block *)0xffffffffffffff58) {
        __assert_fail("&(Element->Data)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x734,
                      "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                     );
      }
      ToWrite = (size_t)(Element->Data)._Begin;
      if ((_CompressionScope == (ebml_integer *)0x0) ||
         (((MatroskaContentEncodingScope)CanCompress & MATROSKA_CONTENTENCODINGSCOPE_BLOCK) == 0)) {
        if (Element == (matroska_block *)0xffffffffffffff58) {
          __assert_fail("&(Element->Data)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x772,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        Written = (Element->Data)._Used;
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x773,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        pmStack_50 = (matroska_block *)
                     (**(code **)((long)(Output->Base).VMT + 0x70))
                               (Output,ToWrite,Written,&BlockHeadSize);
        if (Rendered != (filepos_t *)0x0) {
          *Rendered = BlockHeadSize + *Rendered;
        }
      }
      else if ((_CompressionScope == (ebml_integer *)0x0) ||
              (peVar6 = (_CompressionScope->Base).Context,
              peVar11 = MATROSKA_getContextContentCompAlgo(), peVar6 != peVar11)) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x75f,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        OutBuf = (uint8_t *)(Element->SizeList)._Begin;
        while( true ) {
          sVar2 = ToWrite;
          if (Element == (matroska_block *)0xffffffffffffff78) {
            __assert_fail("&(Element->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x75f,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          if (OutBuf == (uint8_t *)
                        ((Element->SizeList)._Begin +
                        ((Element->SizeList)._Used & 0xfffffffffffffffc))) {
            return (err_t)pmStack_50;
          }
          if (_CompressionScope == (ebml_integer *)0xffffffffffffff98) {
            __assert_fail("&(((ebml_binary*)Header)->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x761,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          pvVar1 = (void *)_CompressionScope->Value;
          sVar13 = EBML_ElementDataSize(&_CompressionScope->Base,1);
          iVar5 = memcmp((void *)sVar2,pvVar1,sVar13);
          sVar2 = ToWrite;
          if (iVar5 != 0) {
            __assert_fail("memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x761,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          if (_CompressionScope == (ebml_integer *)0xffffffffffffff98) {
            __assert_fail("&(((ebml_binary*)Header)->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x762,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          pvVar1 = (void *)_CompressionScope->Value;
          sVar13 = EBML_ElementDataSize(&_CompressionScope->Base,1);
          iVar5 = memcmp((void *)sVar2,pvVar1,sVar13);
          if (iVar5 != 0) break;
          fVar10 = EBML_ElementDataSize(&_CompressionScope->Base,1);
          ToWrite = fVar10 + ToWrite;
          iVar5 = *(int *)OutBuf;
          fVar10 = EBML_ElementDataSize(&_CompressionScope->Base,1);
          Written = iVar5 - fVar10;
          if (Output == (stream *)0x0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x769,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          pmStack_50 = (matroska_block *)
                       (**(code **)((long)(Output->Base).VMT + 0x70))
                                 (Output,ToWrite,Written,&BlockHeadSize);
          if (Rendered != (filepos_t *)0x0) {
            *Rendered = BlockHeadSize + *Rendered;
          }
          ToWrite = BlockHeadSize + ToWrite;
          OutBuf = OutBuf + 4;
        }
        pmStack_50 = (matroska_block *)0xfffffffffffffffd;
      }
      else if (CanCompress._4_4_ == MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
        local_e0 = (undefined1  [8])0x0;
        TmpBuf._Begin = (char *)0x0;
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x740,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        OutBuf = (uint8_t *)(Element->SizeList)._Begin;
        while( true ) {
          if (Element == (matroska_block *)0xffffffffffffff78) {
            __assert_fail("&(Element->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x740,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          if (OutBuf == (uint8_t *)
                        ((Element->SizeList)._Begin +
                        ((Element->SizeList)._Used & 0xfffffffffffffffc))) {
            return (err_t)pmStack_50;
          }
          bVar7 = ArrayResize((array *)local_e0,(long)(*(int *)OutBuf + 100),0);
          if (bVar7 == 0) break;
          TmpBuf._Used = (size_t)local_e0;
          Written = (size_t)TmpBuf._Begin;
          eVar12 = CompressFrameZLib((uint8_t *)ToWrite,(long)*(int *)OutBuf,
                                     (uint8_t **)&TmpBuf._Used,&Written);
          if (eVar12 != 0) {
            ArrayClear((array *)local_e0);
            return (err_t)(matroska_block *)0xfffffffffffffffe;
          }
          if (Output == (stream *)0x0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x751,
                          "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          pmStack_50 = (matroska_block *)
                       (**(code **)((long)(Output->Base).VMT + 0x70))
                                 (Output,TmpBuf._Used,Written,&BlockHeadSize);
          ArrayClear((array *)local_e0);
          if (Rendered != (filepos_t *)0x0) {
            *Rendered = BlockHeadSize + *Rendered;
          }
          ToWrite = ToWrite + (long)*(int *)OutBuf;
          if (pmStack_50 != (matroska_block *)0x0) {
            return (err_t)pmStack_50;
          }
          OutBuf = OutBuf + 4;
        }
        ArrayClear((array *)local_e0);
        pmStack_50 = (matroska_block *)0xfffffffffffffffe;
      }
    }
    else {
      pmStack_50 = (matroska_block *)0xffffffffffffffea;
    }
  }
  return (err_t)pmStack_50;
}

Assistant:

static err_t RenderBlockData(matroska_block *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int ForProfile, filepos_t *Rendered)
{
    err_t Err = ERR_NONE;
    uint8_t BlockHead[5], *Cursor;
    size_t ToWrite, Written, BlockHeadSize = 4;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    assert(Element->Lacing != LACING_AUTO);

    if (Element->TrackNumber < 0x80)
    {
        BlockHead[0] = 0x80 | (Element->TrackNumber & 0xFF);
        Cursor = &BlockHead[1];
    }
    else if (Element->TrackNumber < 0x4000)
    {
        BlockHead[0] = 0x40 | (Element->TrackNumber >> 8);
        BlockHead[1] = Element->TrackNumber & 0xFF;
        Cursor = &BlockHead[2];
        BlockHeadSize = 5;
    }
    else
        return ERR_INVALID_DATA;

    STORE16BE(Cursor,Element->LocalTimestamp);
    Cursor += 2;

    *Cursor = 0;
    if (Element->Invisible)
        *Cursor |= 0x08;
    *Cursor |= Element->Lacing << 1;
    if (EBML_ElementIsType((ebml_element*)Element, MATROSKA_getContextSimpleBlock()))
    {
        if (Element->IsKeyframe)
            *Cursor |= 0x80;
        if (Element->IsDiscardable)
            *Cursor |= 0x01;
    }

    Err = Stream_Write(Output,BlockHead,BlockHeadSize,&Written);
    if (Err != ERR_NONE)
        goto failed;
    if (Written != BlockHeadSize)
    {
        Err = ERR_WRITE;
        goto failed;
    }
    if (Rendered)
        *Rendered = Written;

    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
            {
                Err = ERR_NOT_SUPPORTED;
                goto failed;
            }

            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

#if !defined(CONFIG_ZLIB)
    if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        Err = ERR_NOT_SUPPORTED;
        goto failed;
    }
#endif

    if (Element->Lacing == LACING_AUTO)
        Element->Lacing = GetBestLacingType(Element, ForProfile);
    if (Element->Lacing != LACING_NONE)
    {
        uint8_t *LaceHead = malloc(1 + ARRAYCOUNT(Element->SizeList,int32_t)*4);
        size_t i,LaceSize = 1;
        int32_t DataSize, PrevSize;
        if (!LaceHead)
        {
            Err = ERR_OUT_OF_MEMORY;
            goto failed;
        }
        LaceHead[0] = (ARRAYCOUNT(Element->SizeList,int32_t)-1) & 0xFF; // number of elements in the lace
        if (Element->Lacing == LACING_EBML)
        {
            DataSize = (int32_t)GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope);
            LaceSize += EBML_CodedValueLength(DataSize,EBML_CodedSizeLength(DataSize,0,1),LaceHead+LaceSize, 1);
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = DataSize;
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                LaceSize += EBML_CodedValueLengthSigned(DataSize-PrevSize,EBML_CodedSizeLengthSigned(DataSize-PrevSize,0),LaceHead+LaceSize);
            }
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                while (DataSize >= 0xFF)
                {
                    LaceHead[LaceSize++] = 0xFF;
                    DataSize -= 0xFF;
                }
                LaceHead[LaceSize++] = (uint8_t)DataSize;
            }
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            // nothing to write
        }
        assert(LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4));
        Err = Stream_Write(Output,LaceHead,LaceSize,&Written);
        if (Err != ERR_NONE)
            goto failed;
        if (Rendered)
            *Rendered += Written;
        free(LaceHead);
    }
    Node_SET(Element,MATROSKA_BLOCK_READ_TRACK,&Element->WriteTrack); // now use the write track for consecutive read of the same element

    Cursor = ARRAYBEGIN(Element->Data,uint8_t);
    if (Header && (CompressionScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK))
    {
        int32_t* i;
        if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
        {
#if defined(CONFIG_ZLIB)
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
            {
                uint8_t *OutBuf;
                array TmpBuf;
                ArrayInit(&TmpBuf);
                for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
                {
                    if (!ArrayResize(&TmpBuf,*i + 100,0))
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }
                    OutBuf = ARRAYBEGIN(TmpBuf,uint8_t);
                    ToWrite = ARRAYCOUNT(TmpBuf,uint8_t);
                    if (CompressFrameZLib(Cursor, *i, &OutBuf, &ToWrite) != ERR_NONE)
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }

                    Err = Stream_Write(Output,OutBuf,ToWrite,&Written);
                    ArrayClear(&TmpBuf);
                    if (Rendered)
                        *Rendered += Written;
                    Cursor += *i;
                    if (Err!=ERR_NONE)
                        break;
                }
            }
#endif
        }
        else
        {
            // header compression
            for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
            {
                assert(memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0);
                if (memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))!=0)
                {
                    Err = ERR_INVALID_DATA;
                    goto failed;
                }
                Cursor += EBML_ElementDataSize(Header, 1);
                ToWrite = *i - (size_t)EBML_ElementDataSize(Header, 1);
                Err = Stream_Write(Output,Cursor,ToWrite,&Written);
                if (Rendered)
                    *Rendered += Written;
                Cursor += Written;
            }
        }
    }
    else
    {
        ToWrite = ARRAYCOUNT(Element->Data,uint8_t);
        Err = Stream_Write(Output,Cursor,ToWrite,&Written);
        if (Rendered)
            *Rendered += Written;
    }

failed:
    return Err;
}